

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

bool __thiscall wasm::needsQuoting(wasm *this,Name name)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  string local_58;
  undefined1 local_38 [8];
  string mangled;
  Name name_local;
  
  mangled.field_2._8_8_ = this;
  IString::toString_abi_cxx11_(&local_58,(IString *)((long)&mangled.field_2 + 8));
  asmangle((string *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
        std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
  __y._M_str = name.super_IString.str._M_len;
  __y._M_len = mangled.field_2._8_8_;
  bVar1 = std::operator!=(__x,__y);
  std::__cxx11::string::~string((string *)local_38);
  return bVar1;
}

Assistant:

static bool needsQuoting(Name name) {
  auto mangled = asmangle(name.toString());
  return mangled != name.str;
}